

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::timerEvent(QAbstractButton *this,QTimerEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractButtonPrivate *this_00;
  QAbstractButtonPrivate *in_RSI;
  QPointer<QAbstractButton> *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QPointer<QAbstractButton> guard;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffe8;
  int msec;
  
  msec = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractButton *)0x500fbf);
  iVar3 = QTimerEvent::timerId((QTimerEvent *)0x500fce);
  iVar4 = QBasicTimer::timerId((QBasicTimer *)0x500fe3);
  if (iVar3 == iVar4) {
    QBasicTimer::start((QBasicTimer *)this_00,msec,
                       (QObject *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
    if (((byte)this_00->field_0x28c >> 4 & 1) != 0) {
      QPointer<QAbstractButton>::QPointer<void>
                (in_RDI,(QAbstractButton *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      (**(code **)((in_RDI->wp).d + 0x1b0))();
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x50106d);
      if (bVar2) {
        QAbstractButtonPrivate::emitReleased
                  ((QAbstractButtonPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
      }
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x501087);
      if (bVar2) {
        QAbstractButtonPrivate::emitClicked
                  ((QAbstractButtonPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
      }
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x5010a1);
      if (bVar2) {
        QAbstractButtonPrivate::emitPressed
                  ((QAbstractButtonPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
      }
      QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x5010bb);
    }
  }
  else {
    iVar3 = QTimerEvent::timerId((QTimerEvent *)0x5010c7);
    iVar4 = QBasicTimer::timerId((QBasicTimer *)0x5010dc);
    if (iVar3 == iVar4) {
      QBasicTimer::stop();
      QAbstractButtonPrivate::click(in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::timerEvent(QTimerEvent *e)
{
    Q_D(QAbstractButton);
    if (e->timerId() == d->repeatTimer.timerId()) {
        d->repeatTimer.start(d->autoRepeatInterval, this);
        if (d->down) {
            QPointer<QAbstractButton> guard(this);
            nextCheckState();
            if (guard)
                d->emitReleased();
            if (guard)
                d->emitClicked();
            if (guard)
                d->emitPressed();
        }
    } else if (e->timerId() == d->animateTimer.timerId()) {
        d->animateTimer.stop();
        d->click();
    }
}